

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_get_record_expansion(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_transform *pmVar1;
  mbedtls_cipher_mode_t mVar2;
  uint uVar3;
  size_t sVar4;
  mbedtls_ssl_transform *transform;
  size_t transform_expansion;
  mbedtls_ssl_context *ssl_local;
  
  pmVar1 = ssl->transform_out;
  if (pmVar1 == (mbedtls_ssl_transform *)0x0) {
    sVar4 = mbedtls_ssl_hdr_len(ssl);
    ssl_local._4_4_ = (int)sVar4;
  }
  else {
    mVar2 = mbedtls_cipher_get_cipher_mode(&pmVar1->cipher_ctx_enc);
    if (mVar2 == MBEDTLS_MODE_CBC) {
      sVar4 = pmVar1->maclen;
      uVar3 = mbedtls_cipher_get_block_size(&pmVar1->cipher_ctx_enc);
      transform._0_4_ = (int)sVar4 + uVar3;
    }
    else {
      if (2 < mVar2 - MBEDTLS_MODE_GCM) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0x1869,"should never happen");
        return -0x6c00;
      }
      transform._0_4_ = (int)pmVar1->minlen;
    }
    sVar4 = mbedtls_ssl_hdr_len(ssl);
    ssl_local._4_4_ = (int)sVar4 + (int)transform;
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_get_record_expansion( const mbedtls_ssl_context *ssl )
{
    size_t transform_expansion;
    const mbedtls_ssl_transform *transform = ssl->transform_out;

#if defined(MBEDTLS_ZLIB_SUPPORT)
    if( ssl->session_out->compression != MBEDTLS_SSL_COMPRESS_NULL )
        return( MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE );
#endif

    if( transform == NULL )
        return( (int) mbedtls_ssl_hdr_len( ssl ) );

    switch( mbedtls_cipher_get_cipher_mode( &transform->cipher_ctx_enc ) )
    {
        case MBEDTLS_MODE_GCM:
        case MBEDTLS_MODE_CCM:
        case MBEDTLS_MODE_STREAM:
            transform_expansion = transform->minlen;
            break;

        case MBEDTLS_MODE_CBC:
            transform_expansion = transform->maclen
                      + mbedtls_cipher_get_block_size( &transform->cipher_ctx_enc );
            break;

        default:
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    return( (int)( mbedtls_ssl_hdr_len( ssl ) + transform_expansion ) );
}